

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  Bitmask mThis;
  Bitmask mNext;
  ulong uStack_90;
  int i;
  Bitmask mBestNoIn;
  Bitmask mPrev;
  int seenZeroNoIN;
  int seenZero;
  u16 mNoOmit;
  Bitmask mBest;
  WhereLoop *pNew;
  int bIn;
  int nConstraint;
  sqlite3_index_info *p;
  SrcList_item *pSrc;
  WhereClause *pWC;
  Parse *pParse;
  WhereInfo *pWInfo;
  Bitmask BStack_28;
  int rc;
  Bitmask mUnusable_local;
  Bitmask mPrereq_local;
  WhereLoopBuilder *pBuilder_local;
  
  pWInfo._4_4_ = 0;
  pParse = (Parse *)pBuilder->pWInfo;
  pWC = (WhereClause *)((WhereInfo *)pParse)->pParse;
  pSrc = (SrcList_item *)pBuilder->pWC;
  mBest = (Bitmask)pBuilder->pNew;
  p = (sqlite3_index_info *)(((WhereInfo *)pParse)->pTabList->a + ((WhereLoop *)mBest)->iTab);
  BStack_28 = mUnusable;
  mUnusable_local = mPrereq;
  mPrereq_local = (Bitmask)pBuilder;
  _bIn = allocateIndexInfo((Parse *)pWC,(WhereClause *)pSrc,mUnusable,(SrcList_item *)p,
                           pBuilder->pOrderBy,(u16 *)((long)&seenZeroNoIN + 2));
  if (_bIn == (sqlite3_index_info *)0x0) {
    pBuilder_local._4_4_ = 7;
  }
  else {
    *(undefined2 *)(mBest + 0x12) = 0;
    *(undefined4 *)(mBest + 0x28) = 0x400;
    *(undefined2 *)(mBest + 0x2c) = 0;
    *(undefined1 *)(mBest + 0x1c) = 0;
    pNew._4_4_ = _bIn->nConstraint;
    iVar2 = whereLoopResize((sqlite3 *)pWC->pWInfo,(WhereLoop *)mBest,pNew._4_4_);
    if (iVar2 == 0) {
      pWInfo._4_4_ = whereLoopAddVirtualOne
                               ((WhereLoopBuilder *)mPrereq_local,mUnusable_local,0xffffffffffffffff
                                ,0,_bIn,seenZeroNoIN._2_2_,(int *)&pNew);
      if ((pWInfo._4_4_ == 0) &&
         ((_seenZero = *(ulong *)mBest & (mUnusable_local ^ 0xffffffffffffffff), _seenZero != 0 ||
          ((int)pNew != 0)))) {
        bVar4 = false;
        mBestNoIn = 0;
        uStack_90 = 0;
        bVar1 = bVar4;
        if ((int)pNew != 0) {
          pWInfo._4_4_ = whereLoopAddVirtualOne
                                   ((WhereLoopBuilder *)mPrereq_local,mUnusable_local,
                                    0xffffffffffffffff,1,_bIn,seenZeroNoIN._2_2_,(int *)&pNew);
          uStack_90 = *(ulong *)mBest & (mUnusable_local ^ 0xffffffffffffffff);
          bVar4 = uStack_90 == 0;
          bVar1 = bVar4;
        }
        while (pWInfo._4_4_ == 0) {
          mThis = 0xffffffffffffffff;
          for (mNext._4_4_ = 0; mNext._4_4_ < pNew._4_4_; mNext._4_4_ = mNext._4_4_ + 1) {
            uVar3 = (ulong)(&pSrc->pTab->pCheck)
                           [(long)_bIn->aConstraint[mNext._4_4_].iTermOffset * 8] &
                    (mUnusable_local ^ 0xffffffffffffffff);
            if ((mBestNoIn < uVar3) && (uVar3 < mThis)) {
              mThis = uVar3;
            }
          }
          mBestNoIn = mThis;
          if (mThis == 0xffffffffffffffff) break;
          if ((((mThis != _seenZero) && (mThis != uStack_90)) &&
              (pWInfo._4_4_ = whereLoopAddVirtualOne
                                        ((WhereLoopBuilder *)mPrereq_local,mUnusable_local,
                                         mThis | mUnusable_local,0,_bIn,seenZeroNoIN._2_2_,
                                         (int *)&pNew), *(Bitmask *)mBest == mUnusable_local)) &&
             (bVar4 = true, (int)pNew == 0)) {
            bVar1 = true;
          }
        }
        if (((pWInfo._4_4_ == 0) && (!bVar4)) &&
           (pWInfo._4_4_ = whereLoopAddVirtualOne
                                     ((WhereLoopBuilder *)mPrereq_local,mUnusable_local,
                                      mUnusable_local,0,_bIn,seenZeroNoIN._2_2_,(int *)&pNew),
           (int)pNew == 0)) {
          bVar1 = true;
        }
        if ((pWInfo._4_4_ == 0) && (!bVar1)) {
          pWInfo._4_4_ = whereLoopAddVirtualOne
                                   ((WhereLoopBuilder *)mPrereq_local,mUnusable_local,
                                    mUnusable_local,1,_bIn,seenZeroNoIN._2_2_,(int *)&pNew);
        }
      }
      if (_bIn->needToFreeIdxStr != 0) {
        sqlite3_free(_bIn->idxStr);
      }
      sqlite3DbFreeNN((sqlite3 *)pWC->pWInfo,_bIn);
      pBuilder_local._4_4_ = pWInfo._4_4_;
    }
    else {
      sqlite3DbFree((sqlite3 *)pWC->pWInfo,_bIn);
      pBuilder_local._4_4_ = 7;
    }
  }
  return pBuilder_local._4_4_;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making 
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}